

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O0

size_t __thiscall sentencepiece::TrainerSpec::ByteSizeLong(TrainerSpec *this)

{
  uint uVar1;
  int iVar2;
  int32 iVar3;
  TrainerSpec_ModelType value;
  size_t sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  string *psVar6;
  uint64 uVar7;
  InternalMetadata *this_00;
  long lVar8;
  int cached_size;
  int n_3;
  int i_3;
  int n_2;
  int i_2;
  int n_1;
  int i_1;
  int n;
  int i;
  uint32 cached_has_bits;
  size_t total_size;
  TrainerSpec *this_local;
  
  sVar4 = google::protobuf::internal::ExtensionSet::ByteSize(&this->_extensions_);
  iVar2 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(&this->input_);
  _i = google::protobuf::internal::FromIntSize(iVar2);
  _i = _i + sVar4;
  i_1 = 0;
  iVar2 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(&this->input_);
  for (; i_1 < iVar2; i_1 = i_1 + 1) {
    pbVar5 = google::protobuf::
             RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::Get(&this->input_,i_1);
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize(pbVar5);
    _i = sVar4 + _i;
  }
  iVar2 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(&this->accept_language_);
  sVar4 = google::protobuf::internal::FromIntSize(iVar2);
  _i = sVar4 + _i;
  i_2 = 0;
  iVar2 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(&this->accept_language_);
  for (; i_2 < iVar2; i_2 = i_2 + 1) {
    pbVar5 = google::protobuf::
             RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::Get(&this->accept_language_,i_2);
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize(pbVar5);
    _i = sVar4 + _i;
  }
  iVar2 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(&this->control_symbols_);
  sVar4 = google::protobuf::internal::FromIntSize(iVar2);
  _i = sVar4 * 2 + _i;
  i_3 = 0;
  iVar2 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(&this->control_symbols_);
  for (; i_3 < iVar2; i_3 = i_3 + 1) {
    pbVar5 = google::protobuf::
             RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::Get(&this->control_symbols_,i_3);
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize(pbVar5);
    _i = sVar4 + _i;
  }
  iVar2 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(&this->user_defined_symbols_);
  sVar4 = google::protobuf::internal::FromIntSize(iVar2);
  _i = sVar4 * 2 + _i;
  cached_size = 0;
  iVar2 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(&this->user_defined_symbols_);
  for (; cached_size < iVar2; cached_size = cached_size + 1) {
    pbVar5 = google::protobuf::
             RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::Get(&this->user_defined_symbols_,cached_size);
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize(pbVar5);
    _i = sVar4 + _i;
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 0xff) != 0) {
    if ((uVar1 & 1) != 0) {
      psVar6 = _internal_model_prefix_abi_cxx11_(this);
      sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar6);
      _i = sVar4 + 1 + _i;
    }
    if ((uVar1 & 2) != 0) {
      psVar6 = _internal_input_format_abi_cxx11_(this);
      sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar6);
      _i = sVar4 + 1 + _i;
    }
    if ((uVar1 & 4) != 0) {
      psVar6 = _internal_required_chars_abi_cxx11_(this);
      sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar6);
      _i = sVar4 + 2 + _i;
    }
    if ((uVar1 & 8) != 0) {
      psVar6 = _internal_unk_surface_abi_cxx11_(this);
      sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar6);
      _i = sVar4 + 2 + _i;
    }
    if ((uVar1 & 0x10) != 0) {
      psVar6 = _internal_unk_piece_abi_cxx11_(this);
      sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar6);
      _i = sVar4 + 2 + _i;
    }
    if ((uVar1 & 0x20) != 0) {
      psVar6 = _internal_bos_piece_abi_cxx11_(this);
      sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar6);
      _i = sVar4 + 2 + _i;
    }
    if ((uVar1 & 0x40) != 0) {
      psVar6 = _internal_eos_piece_abi_cxx11_(this);
      sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar6);
      _i = sVar4 + 2 + _i;
    }
    if ((uVar1 & 0x80) != 0) {
      psVar6 = _internal_pad_piece_abi_cxx11_(this);
      sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar6);
      _i = sVar4 + 2 + _i;
    }
  }
  if ((uVar1 & 0xff00) != 0) {
    if ((uVar1 & 0x100) != 0) {
      psVar6 = _internal_pretokenization_delimiter_abi_cxx11_(this);
      sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar6);
      _i = sVar4 + 2 + _i;
    }
    if ((uVar1 & 0x200) != 0) {
      psVar6 = _internal_seed_sentencepieces_file_abi_cxx11_(this);
      sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar6);
      _i = sVar4 + 2 + _i;
    }
    if ((uVar1 & 0x400) != 0) {
      iVar3 = _internal_self_test_sample_size(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32Size(iVar3);
      _i = sVar4 + 1 + _i;
    }
    if ((uVar1 & 0x800) != 0) {
      iVar3 = _internal_mining_sentence_size(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32Size(iVar3);
      _i = sVar4 + 1 + _i;
    }
    if ((uVar1 & 0x1000) != 0) {
      uVar7 = _internal_input_sentence_size(this);
      sVar4 = google::protobuf::internal::WireFormatLite::UInt64Size(uVar7);
      _i = sVar4 + 1 + _i;
    }
    if ((uVar1 & 0x2000) != 0) {
      iVar3 = _internal_training_sentence_size(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32Size(iVar3);
      _i = sVar4 + 1 + _i;
    }
    if ((uVar1 & 0x4000) != 0) {
      _i = _i + 3;
    }
    if ((uVar1 & 0x8000) != 0) {
      _i = _i + 3;
    }
  }
  if ((uVar1 & 0xff0000) != 0) {
    if ((uVar1 & 0x10000) != 0) {
      _i = _i + 3;
    }
    if ((uVar1 & 0x20000) != 0) {
      _i = _i + 3;
    }
    if ((uVar1 & 0x40000) != 0) {
      _i = _i + 3;
    }
    if ((uVar1 & 0x80000) != 0) {
      _i = _i + 3;
    }
    if ((uVar1 & 0x100000) != 0) {
      _i = _i + 3;
    }
    if ((uVar1 & 0x200000) != 0) {
      iVar3 = _internal_unk_id(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32Size(iVar3);
      _i = sVar4 + 2 + _i;
    }
    if ((uVar1 & 0x400000) != 0) {
      _i = _i + 6;
    }
    if ((uVar1 & 0x800000) != 0) {
      uVar7 = _internal_differential_privacy_clipping_threshold(this);
      sVar4 = google::protobuf::internal::WireFormatLite::UInt64Size(uVar7);
      _i = sVar4 + 2 + _i;
    }
  }
  if ((uVar1 & 0xff000000) != 0) {
    if ((uVar1 & 0x1000000) != 0) {
      value = _internal_model_type(this);
      sVar4 = google::protobuf::internal::WireFormatLite::EnumSize(value);
      _i = sVar4 + 1 + _i;
    }
    if ((uVar1 & 0x2000000) != 0) {
      iVar3 = _internal_vocab_size(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32Size(iVar3);
      _i = sVar4 + 1 + _i;
    }
    if ((uVar1 & 0x4000000) != 0) {
      _i = _i + 5;
    }
    if ((uVar1 & 0x8000000) != 0) {
      iVar3 = _internal_seed_sentencepiece_size(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32Size(iVar3);
      _i = sVar4 + 1 + _i;
    }
    if ((uVar1 & 0x10000000) != 0) {
      _i = _i + 5;
    }
    if ((uVar1 & 0x20000000) != 0) {
      iVar3 = _internal_num_threads(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32Size(iVar3);
      _i = sVar4 + 2 + _i;
    }
    if ((uVar1 & 0x40000000) != 0) {
      iVar3 = _internal_num_sub_iterations(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32Size(iVar3);
      _i = sVar4 + 2 + _i;
    }
    if ((uVar1 & 0x80000000) != 0) {
      iVar3 = _internal_max_sentence_length(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32Size(iVar3);
      _i = sVar4 + 2 + _i;
    }
  }
  uVar1 = (this->_has_bits_).has_bits_[1];
  if ((uVar1 & 0xff) != 0) {
    if ((uVar1 & 1) != 0) {
      iVar3 = _internal_max_sentencepiece_length(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32Size(iVar3);
      _i = sVar4 + 2 + _i;
    }
    if ((uVar1 & 2) != 0) {
      _i = _i + 3;
    }
    if ((uVar1 & 4) != 0) {
      _i = _i + 3;
    }
    if ((uVar1 & 8) != 0) {
      _i = _i + 3;
    }
    if ((uVar1 & 0x10) != 0) {
      _i = _i + 3;
    }
    if ((uVar1 & 0x20) != 0) {
      _i = _i + 3;
    }
    if ((uVar1 & 0x40) != 0) {
      _i = _i + 3;
    }
    if ((uVar1 & 0x80) != 0) {
      iVar3 = _internal_bos_id(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32Size(iVar3);
      _i = sVar4 + 2 + _i;
    }
  }
  if ((uVar1 & 0x300) != 0) {
    if ((uVar1 & 0x100) != 0) {
      iVar3 = _internal_eos_id(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32Size(iVar3);
      _i = sVar4 + 2 + _i;
    }
    if ((uVar1 & 0x200) != 0) {
      iVar3 = _internal_pad_id(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32Size(iVar3);
      _i = sVar4 + 2 + _i;
    }
  }
  if (((uint)(this->super_MessageLite)._internal_metadata_.ptr_ & 1) == 1) {
    this_00 = &(this->super_MessageLite)._internal_metadata_;
    if (((uint)this_00->ptr_ & 1) == 1) {
      google::protobuf::internal::InternalMetadata::
      PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
                (this_00);
    }
    else {
      google::protobuf::internal::GetEmptyString_abi_cxx11_();
    }
    lVar8 = std::__cxx11::string::size();
    _i = lVar8 + _i;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(_i);
  SetCachedSize(this,iVar2);
  return _i;
}

Assistant:

size_t TrainerSpec::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:sentencepiece.TrainerSpec)
  size_t total_size = 0;

  total_size += _extensions_.ByteSize();

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated string input = 1;
  total_size += 1 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(input_.size());
  for (int i = 0, n = input_.size(); i < n; i++) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
      input_.Get(i));
  }

  // repeated string accept_language = 5;
  total_size += 1 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(accept_language_.size());
  for (int i = 0, n = accept_language_.size(); i < n; i++) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
      accept_language_.Get(i));
  }

  // repeated string control_symbols = 30;
  total_size += 2 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(control_symbols_.size());
  for (int i = 0, n = control_symbols_.size(); i < n; i++) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
      control_symbols_.Get(i));
  }

  // repeated string user_defined_symbols = 31;
  total_size += 2 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(user_defined_symbols_.size());
  for (int i = 0, n = user_defined_symbols_.size(); i < n; i++) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
      user_defined_symbols_.Get(i));
  }

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x000000ffu) {
    // optional string model_prefix = 2;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_model_prefix());
    }

    // optional string input_format = 7;
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_input_format());
    }

    // optional string required_chars = 36;
    if (cached_has_bits & 0x00000004u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_required_chars());
    }

    // optional string unk_surface = 44 [default = " \342\201\207 "];
    if (cached_has_bits & 0x00000008u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_unk_surface());
    }

    // optional string unk_piece = 45 [default = "<unk>"];
    if (cached_has_bits & 0x00000010u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_unk_piece());
    }

    // optional string bos_piece = 46 [default = "<s>"];
    if (cached_has_bits & 0x00000020u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_bos_piece());
    }

    // optional string eos_piece = 47 [default = "</s>"];
    if (cached_has_bits & 0x00000040u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_eos_piece());
    }

    // optional string pad_piece = 48 [default = "<pad>"];
    if (cached_has_bits & 0x00000080u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_pad_piece());
    }

  }
  if (cached_has_bits & 0x0000ff00u) {
    // optional string pretokenization_delimiter = 53 [default = ""];
    if (cached_has_bits & 0x00000100u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_pretokenization_delimiter());
    }

    // optional string seed_sentencepieces_file = 54 [default = ""];
    if (cached_has_bits & 0x00000200u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_seed_sentencepieces_file());
    }

    // optional int32 self_test_sample_size = 6 [default = 0];
    if (cached_has_bits & 0x00000400u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
          this->_internal_self_test_sample_size());
    }

    // optional int32 mining_sentence_size = 12 [deprecated = true];
    if (cached_has_bits & 0x00000800u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
          this->_internal_mining_sentence_size());
    }

    // optional uint64 input_sentence_size = 11 [default = 0];
    if (cached_has_bits & 0x00001000u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::UInt64Size(
          this->_internal_input_sentence_size());
    }

    // optional int32 training_sentence_size = 13 [deprecated = true];
    if (cached_has_bits & 0x00002000u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
          this->_internal_training_sentence_size());
    }

    // optional bool enable_differential_privacy = 50 [default = false];
    if (cached_has_bits & 0x00004000u) {
      total_size += 2 + 1;
    }

    // optional bool treat_whitespace_as_suffix = 24 [default = false];
    if (cached_has_bits & 0x00008000u) {
      total_size += 2 + 1;
    }

  }
  if (cached_has_bits & 0x00ff0000u) {
    // optional bool allow_whitespace_only_pieces = 26 [default = false];
    if (cached_has_bits & 0x00010000u) {
      total_size += 2 + 1;
    }

    // optional bool split_digits = 25 [default = false];
    if (cached_has_bits & 0x00020000u) {
      total_size += 2 + 1;
    }

    // optional bool byte_fallback = 35 [default = false];
    if (cached_has_bits & 0x00040000u) {
      total_size += 2 + 1;
    }

    // optional bool use_all_vocab = 34 [default = false];
    if (cached_has_bits & 0x00080000u) {
      total_size += 2 + 1;
    }

    // optional bool train_extremely_large_corpus = 49 [default = false];
    if (cached_has_bits & 0x00100000u) {
      total_size += 2 + 1;
    }

    // optional int32 unk_id = 40 [default = 0];
    if (cached_has_bits & 0x00200000u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
          this->_internal_unk_id());
    }

    // optional float differential_privacy_noise_level = 51 [default = 0];
    if (cached_has_bits & 0x00400000u) {
      total_size += 2 + 4;
    }

    // optional uint64 differential_privacy_clipping_threshold = 52 [default = 0];
    if (cached_has_bits & 0x00800000u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::UInt64Size(
          this->_internal_differential_privacy_clipping_threshold());
    }

  }
  if (cached_has_bits & 0xff000000u) {
    // optional .sentencepiece.TrainerSpec.ModelType model_type = 3 [default = UNIGRAM];
    if (cached_has_bits & 0x01000000u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::EnumSize(this->_internal_model_type());
    }

    // optional int32 vocab_size = 4 [default = 8000];
    if (cached_has_bits & 0x02000000u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
          this->_internal_vocab_size());
    }

    // optional float character_coverage = 10 [default = 0.9995];
    if (cached_has_bits & 0x04000000u) {
      total_size += 1 + 4;
    }

    // optional int32 seed_sentencepiece_size = 14 [default = 1000000];
    if (cached_has_bits & 0x08000000u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
          this->_internal_seed_sentencepiece_size());
    }

    // optional float shrinking_factor = 15 [default = 0.75];
    if (cached_has_bits & 0x10000000u) {
      total_size += 1 + 4;
    }

    // optional int32 num_threads = 16 [default = 16];
    if (cached_has_bits & 0x20000000u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
          this->_internal_num_threads());
    }

    // optional int32 num_sub_iterations = 17 [default = 2];
    if (cached_has_bits & 0x40000000u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
          this->_internal_num_sub_iterations());
    }

    // optional int32 max_sentence_length = 18 [default = 4192];
    if (cached_has_bits & 0x80000000u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
          this->_internal_max_sentence_length());
    }

  }
  cached_has_bits = _has_bits_[1];
  if (cached_has_bits & 0x000000ffu) {
    // optional int32 max_sentencepiece_length = 20 [default = 16];
    if (cached_has_bits & 0x00000001u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
          this->_internal_max_sentencepiece_length());
    }

    // optional bool shuffle_input_sentence = 19 [default = true];
    if (cached_has_bits & 0x00000002u) {
      total_size += 2 + 1;
    }

    // optional bool split_by_unicode_script = 21 [default = true];
    if (cached_has_bits & 0x00000004u) {
      total_size += 2 + 1;
    }

    // optional bool split_by_number = 23 [default = true];
    if (cached_has_bits & 0x00000008u) {
      total_size += 2 + 1;
    }

    // optional bool split_by_whitespace = 22 [default = true];
    if (cached_has_bits & 0x00000010u) {
      total_size += 2 + 1;
    }

    // optional bool vocabulary_output_piece_score = 32 [default = true];
    if (cached_has_bits & 0x00000020u) {
      total_size += 2 + 1;
    }

    // optional bool hard_vocab_limit = 33 [default = true];
    if (cached_has_bits & 0x00000040u) {
      total_size += 2 + 1;
    }

    // optional int32 bos_id = 41 [default = 1];
    if (cached_has_bits & 0x00000080u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
          this->_internal_bos_id());
    }

  }
  if (cached_has_bits & 0x00000300u) {
    // optional int32 eos_id = 42 [default = 2];
    if (cached_has_bits & 0x00000100u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
          this->_internal_eos_id());
    }

    // optional int32 pad_id = 43 [default = -1];
    if (cached_has_bits & 0x00000200u) {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
          this->_internal_pad_id());
    }

  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}